

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O2

void __thiscall
iu_Expression_x_iutest_x_Logical_Test::Body(iu_Expression_x_iutest_x_Logical_Test *this)

{
  int iVar1;
  char *in_R9;
  bool local_249;
  int local_248;
  int local_244;
  ExpressionResult local_240;
  iuCodeMessage local_218;
  AssertionResult iutest_ar;
  undefined1 local_1c0 [40];
  Fixed local_198;
  
  iVar1 = 0x2a;
  local_244 = iVar1;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_1c0,&local_244);
  local_248 = iVar1;
  iutest::detail::ExpressionLHS<int>::operator==
            (&local_240,(ExpressionLHS<int> *)local_1c0,&local_248);
  local_249 = true;
  iutest::detail::ExpressionResult::operator&&((ExpressionResult *)&local_218,&local_240,&local_249)
  ;
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_218,true);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)(local_1c0 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&local_240,(internal *)&iutest_ar,
               (AssertionResult *)
               "IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() == 42 && g() == false))","false","true",
               in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x4e,local_240.m_result.m_message._M_dataplus._M_p);
    local_218._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_218,&local_198);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_244 = iVar1;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_1c0,&local_244);
  local_248 = iVar1;
  iutest::detail::ExpressionLHS<int>::operator!=
            (&local_240,(ExpressionLHS<int> *)local_1c0,&local_248);
  local_249 = true;
  iutest::detail::ExpressionResult::operator||((ExpressionResult *)&local_218,&local_240,&local_249)
  ;
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_218,true);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)(local_1c0 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&local_240,(internal *)&iutest_ar,
               (AssertionResult *)
               "IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() != 42 || g() == false))","false","true",
               in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x4f,local_240.m_result.m_message._M_dataplus._M_p);
    local_218._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_218,&local_198);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(Expression, Logical)
{
    IUTEST_EXPECT(f() == 42 && g() == false );
    IUTEST_EXPECT(f() != 42 || g() == false );
}